

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Matrix.c
# Opt level: O2

void Llb_MtrVerifyColumnsAll(Llb_Mtr_t *p)

{
  int *piVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  
  uVar3 = 0;
  uVar2 = (ulong)(uint)p->nRows;
  if (p->nRows < 1) {
    uVar2 = uVar3;
  }
  do {
    if (uVar3 == uVar2) {
      return;
    }
    uVar5 = 0;
    uVar4 = (ulong)(uint)p->nCols;
    if (p->nCols < 1) {
      uVar4 = uVar5;
    }
    iVar6 = 0;
    for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
      iVar6 = iVar6 + (uint)(p->pMatrix[uVar5][uVar3] == '\x01');
    }
    piVar1 = p->pRowSums + uVar3;
    uVar3 = uVar3 + 1;
  } while (iVar6 == *piVar1);
  __assert_fail("Counter == p->pRowSums[iRow]",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb1Matrix.c"
                ,100,"void Llb_MtrVerifyColumnsAll(Llb_Mtr_t *)");
}

Assistant:

void Llb_MtrVerifyColumnsAll( Llb_Mtr_t * p )
{
    int iRow, iCol, Counter;
    for ( iRow = 0; iRow < p->nRows; iRow++ )
    {
        Counter = 0;
        for ( iCol = 0; iCol < p->nCols; iCol++ )
            if ( p->pMatrix[iCol][iRow] == 1 )
                Counter++;
        assert( Counter == p->pRowSums[iRow] );
    }
}